

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_conn.cpp
# Opt level: O0

int __thiscall
CNetConnection::Feed(CNetConnection *this,CNetPacketConstruct *pPacket,NETADDR_conflict *pAddr)

{
  byte bVar1;
  TOKEN TVar2;
  undefined8 uVar3;
  int iVar4;
  CNetConnection *this_00;
  CConfig *pCVar5;
  undefined8 *in_RDX;
  CNetConnection *in_RSI;
  CNetConnection *in_RDI;
  long in_FS_OFFSET;
  TOKEN Token;
  int CtrlMsg;
  int64 Now;
  char Str [128];
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff48;
  TOKEN TVar6;
  uint in_stack_ffffffffffffff4c;
  int local_8c;
  char local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->m_Sequence < in_RDI->m_PeerAck) {
    if ((in_RSI->m_RemoteClosed < (int)(uint)in_RDI->m_PeerAck) &&
       ((int)(uint)in_RDI->m_Sequence < in_RSI->m_RemoteClosed)) {
      local_8c = 0;
      goto LAB_00157174;
    }
  }
  else if ((in_RSI->m_RemoteClosed < (int)(uint)in_RDI->m_PeerAck) ||
          ((int)(uint)in_RDI->m_Sequence < in_RSI->m_RemoteClosed)) {
    local_8c = 0;
    goto LAB_00157174;
  }
  in_RDI->m_PeerAck = (unsigned_short)in_RSI->m_RemoteClosed;
  this_00 = (CNetConnection *)time_get();
  TVar6._0_2_ = in_RSI->m_Sequence;
  TVar6._2_2_ = in_RSI->m_Ack;
  if ((TVar6 == 0xffffffff) ||
     (TVar2._0_2_ = in_RSI->m_Sequence, TVar2._2_2_ = in_RSI->m_Ack, TVar2 != in_RDI->m_Token)) {
    local_8c = 0;
  }
  else {
    if ((in_RSI->m_State & 2) != 0) {
      Resend(in_RDI);
    }
    if ((in_RSI->m_State & 8) == 0) {
      if ((in_RSI->m_State & 1) == 0) {
        iVar4 = State(in_RDI);
        if (iVar4 == 3) {
          in_RDI->m_LastRecvTime = (int64)this_00;
          in_RDI->m_State = 4;
          pCVar5 = Config((CNetConnection *)0x15711d);
          if (pCVar5->m_Debug != 0) {
            dbg_msg("connection","connecting online");
          }
        }
      }
      else {
        bVar1 = *(byte *)&(in_RSI->m_Buffer).super_CRingBufferBase.m_pProduce;
        in_stack_ffffffffffffff4c = (uint)bVar1;
        if (in_stack_ffffffffffffff4c == 4) {
          iVar4 = net_addr_comp((NETADDR *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffff48),
                                (NETADDR *)in_RDI,in_stack_ffffffffffffff3c);
          if (iVar4 == 0) {
            in_RDI->m_State = 5;
            in_RDI->m_RemoteClosed = 1;
            memset(local_88,0,0x80);
            if (1 < *(int *)&in_RSI->field_0x14) {
              if (*(int *)&in_RSI->field_0x14 < 0x80) {
                str_copy((char *)in_RDI,
                         (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
              }
              else {
                str_copy((char *)in_RDI,
                         (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
              }
              str_sanitize_strong(local_88);
            }
            if ((in_RDI->m_BlockCloseMsg & 1U) == 0) {
              SetError(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38))
              ;
            }
            pCVar5 = Config((CNetConnection *)0x156ec5);
            if (pCVar5->m_Debug != 0) {
              dbg_msg("conn","closed reason=\'%s\'",local_88);
            }
          }
          local_8c = 0;
          goto LAB_00157174;
        }
        if (in_stack_ffffffffffffff4c == 5) {
          in_RDI->m_PeerToken = *(TOKEN *)&in_RSI->m_PeerAck;
          iVar4 = State(in_RDI);
          if (iVar4 == 1) {
            in_RDI->m_LastRecvTime = (int64)this_00;
            in_RDI->m_State = 2;
            SendControlWithToken(this_00,in_stack_ffffffffffffff4c);
            dbg_msg("connection","got token, replying, token=%x mytoken=%x",
                    (ulong)in_RDI->m_PeerToken,(ulong)in_RDI->m_Token);
          }
          else {
            pCVar5 = Config((CNetConnection *)0x156f73);
            if (pCVar5->m_Debug != 0) {
              dbg_msg("connection","got token, token=%x",(ulong)in_RDI->m_PeerToken);
            }
          }
        }
        else {
          iVar4 = State(in_RDI);
          if (iVar4 == 0) {
            if (in_stack_ffffffffffffff4c == 1) {
              TVar6 = in_RDI->m_Token;
              Reset(in_RDI);
              mem_zero(in_RDI,in_stack_ffffffffffffff3c);
              in_RDI->m_State = 3;
              uVar3 = *in_RDX;
              (in_RDI->m_PeerAddr).type = (int)uVar3;
              (in_RDI->m_PeerAddr).ip[0] = (char)((ulong)uVar3 >> 0x20);
              (in_RDI->m_PeerAddr).ip[1] = (char)((ulong)uVar3 >> 0x28);
              (in_RDI->m_PeerAddr).ip[2] = (char)((ulong)uVar3 >> 0x30);
              (in_RDI->m_PeerAddr).ip[3] = (char)((ulong)uVar3 >> 0x38);
              *(undefined8 *)((in_RDI->m_PeerAddr).ip + 4) = in_RDX[1];
              *(undefined8 *)((in_RDI->m_PeerAddr).ip + 0xc) = in_RDX[2];
              in_RDI->m_PeerToken = *(TOKEN *)&in_RSI->m_PeerAck;
              in_RDI->m_Token = TVar6;
              in_RDI->m_LastSendTime = (int64)this_00;
              in_RDI->m_LastRecvTime = (int64)this_00;
              in_RDI->m_LastUpdateTime = (int64)this_00;
              SendControl(in_RSI,(int)((ulong)in_RDX >> 0x20),this_00,in_stack_ffffffffffffff4c);
              pCVar5 = Config((CNetConnection *)0x157072);
              if (pCVar5->m_Debug != 0) {
                dbg_msg("connection","got connection, sending accept");
              }
            }
          }
          else {
            iVar4 = State(in_RDI);
            if ((iVar4 == 2) && (in_stack_ffffffffffffff4c == 2)) {
              in_RDI->m_LastRecvTime = (int64)this_00;
              in_RDI->m_State = 4;
              pCVar5 = Config((CNetConnection *)0x1570c7);
              if (pCVar5->m_Debug != 0) {
                dbg_msg("connection","got accept. connection online");
              }
            }
          }
        }
      }
      iVar4 = State(in_RDI);
      if (iVar4 == 4) {
        in_RDI->m_LastRecvTime = (int64)this_00;
        AckChunks(this_00,in_stack_ffffffffffffff4c);
      }
      local_8c = 1;
    }
    else {
      local_8c = 1;
    }
  }
LAB_00157174:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_8c;
}

Assistant:

int CNetConnection::Feed(CNetPacketConstruct *pPacket, NETADDR *pAddr)
{
	// check if actual ack value is valid(own sequence..latest peer ack)
	if(m_Sequence >= m_PeerAck)
	{
		if(pPacket->m_Ack < m_PeerAck || pPacket->m_Ack > m_Sequence)
			return 0;
	}
	else
	{
		if(pPacket->m_Ack < m_PeerAck && pPacket->m_Ack > m_Sequence)
			return 0;
	}
	m_PeerAck = pPacket->m_Ack;

	int64 Now = time_get();

	if(pPacket->m_Token == NET_TOKEN_NONE || pPacket->m_Token != m_Token)
		return 0;

	// check if resend is requested
	if(pPacket->m_Flags&NET_PACKETFLAG_RESEND)
		Resend();

	if(pPacket->m_Flags&NET_PACKETFLAG_CONNLESS)
		return 1;

	//
	if(pPacket->m_Flags&NET_PACKETFLAG_CONTROL)
	{
		int CtrlMsg = pPacket->m_aChunkData[0];

		if(CtrlMsg == NET_CTRLMSG_CLOSE)
		{
			if(net_addr_comp(&m_PeerAddr, pAddr, true) == 0)
			{
				m_State = NET_CONNSTATE_ERROR;
				m_RemoteClosed = 1;

				char Str[128] = {0};
				if(pPacket->m_DataSize > 1)
				{
					// make sure to sanitize the error string form the other party
					if(pPacket->m_DataSize < 128)
						str_copy(Str, (char *)&pPacket->m_aChunkData[1], pPacket->m_DataSize);
					else
						str_copy(Str, (char *)&pPacket->m_aChunkData[1], sizeof(Str));
					str_sanitize_strong(Str);
				}

				if(!m_BlockCloseMsg)
				{
					// set the error string
					SetError(Str);
				}

				if(Config()->m_Debug)
					dbg_msg("conn", "closed reason='%s'", Str);
			}
			return 0;
		}
		else
		{
			if(CtrlMsg == NET_CTRLMSG_TOKEN)
			{
				m_PeerToken = pPacket->m_ResponseToken;

				if(State() == NET_CONNSTATE_TOKEN)
				{
					m_LastRecvTime = Now;
					m_State = NET_CONNSTATE_CONNECT;
					SendControlWithToken(NET_CTRLMSG_CONNECT);
					dbg_msg("connection", "got token, replying, token=%x mytoken=%x", m_PeerToken, m_Token);
				}
				else if(Config()->m_Debug)
					dbg_msg("connection", "got token, token=%x", m_PeerToken);
			}
			else
			{
				if(State() == NET_CONNSTATE_OFFLINE)
				{
					if(CtrlMsg == NET_CTRLMSG_CONNECT)
					{
						// send response and init connection
						TOKEN Token = m_Token;
						Reset();
						mem_zero(m_ErrorString, sizeof(m_ErrorString));
						m_State = NET_CONNSTATE_PENDING;
						m_PeerAddr = *pAddr;
						m_PeerToken = pPacket->m_ResponseToken;
						m_Token = Token;
						m_LastSendTime = Now;
						m_LastRecvTime = Now;
						m_LastUpdateTime = Now;
						SendControl(NET_CTRLMSG_ACCEPT, 0, 0);
						if(Config()->m_Debug)
							dbg_msg("connection", "got connection, sending accept");
					}
				}
				else if(State() == NET_CONNSTATE_CONNECT)
				{
					// connection made
					if(CtrlMsg == NET_CTRLMSG_ACCEPT)
					{
						m_LastRecvTime = Now;
						m_State = NET_CONNSTATE_ONLINE;
						if(Config()->m_Debug)
							dbg_msg("connection", "got accept. connection online");
					}
				}
			}
		}
	}
	else
	{
		if(State() == NET_CONNSTATE_PENDING)
		{
			m_LastRecvTime = Now;
			m_State = NET_CONNSTATE_ONLINE;
			if(Config()->m_Debug)
				dbg_msg("connection", "connecting online");
		}
	}

	if(State() == NET_CONNSTATE_ONLINE)
	{
		m_LastRecvTime = Now;
		AckChunks(pPacket->m_Ack);
	}

	return 1;
}